

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-opt64.c
# Opt level: O2

size_t KeccakP1600_12rounds_FastLoop_Absorb
                 (void *state,uint laneCount,uchar *data,size_t dataByteLen)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  
  local_d0 = *(ulong *)((long)state + 0x28);
  local_148 = *(ulong *)((long)state + 0x30);
  auVar41 = *state;
  auVar42[8] = 0xff;
  auVar42._0_8_ = 0xffffffffffffffff;
  auVar42[9] = 0xff;
  auVar42[10] = 0xff;
  auVar42[0xb] = 0xff;
  auVar42[0xc] = 0xff;
  auVar42[0xd] = 0xff;
  auVar42[0xe] = 0xff;
  auVar42[0xf] = 0xff;
  auVar42[0x10] = 0xff;
  auVar42[0x11] = 0xff;
  auVar42[0x12] = 0xff;
  auVar42[0x13] = 0xff;
  auVar42[0x14] = 0xff;
  auVar42[0x15] = 0xff;
  auVar42[0x16] = 0xff;
  auVar42[0x17] = 0xff;
  auVar42[0x18] = 0xff;
  auVar42[0x19] = 0xff;
  auVar42[0x1a] = 0xff;
  auVar42[0x1b] = 0xff;
  auVar42[0x1c] = 0xff;
  auVar42[0x1d] = 0xff;
  auVar42[0x1e] = 0xff;
  auVar42[0x1f] = 0xff;
  auVar43._8_8_ = 0x8000000080008008;
  auVar43._0_8_ = 0x8000000080008008;
  local_138 = *(ulong *)((long)state + 0x20);
  local_e8 = *(ulong *)((long)state + 0x58);
  uVar5 = *(ulong *)((long)state + 0x88);
  local_110 = *(ulong *)((long)state + 0xa8);
  local_130 = *(ulong *)((long)state + 0xb0);
  local_100 = *(ulong *)((long)state + 0xb8);
  local_d8 = *(ulong *)((long)state + 0xc0);
  local_f8 = *(ulong *)((long)state + 0x38);
  local_118 = *(ulong *)((long)state + 0x40);
  local_c8 = *(ulong *)((long)state + 0x48);
  local_108 = *(ulong *)((long)state + 0x50);
  local_e0 = *(ulong *)((long)state + 0x60);
  local_128 = *(ulong *)((long)state + 0x68);
  local_120 = *(ulong *)((long)state + 0x70);
  local_f0 = *(ulong *)((long)state + 0x78);
  local_160 = *(ulong *)((long)state + 0x80);
  local_150 = *(ulong *)((long)state + 0x90);
  local_140 = *(ulong *)((long)state + 0x98);
  local_158 = *(ulong *)((long)state + 0xa0);
  for (lVar15 = 0; (ulong)(laneCount * 8) <= dataByteLen + lVar15;
      lVar15 = lVar15 - (ulong)(laneCount * 8)) {
    if (laneCount == 0x15) {
      auVar41 = auVar41 ^ *(undefined1 (*) [32])data;
      local_138 = local_138 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x20);
      local_d0 = local_d0 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x20) + 8);
      local_f8 = local_f8 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x20) + 0x18);
      uVar5 = uVar5 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x80) + 8);
      local_e8 = local_e8 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x40) + 0x18);
      local_120 = local_120 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x60) + 0x10);
      local_118 = local_118 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x40);
      local_148 = local_148 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x20) + 0x10);
      local_c8 = local_c8 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x40) + 8);
      local_108 = local_108 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x40) + 0x10);
      local_e0 = local_e0 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x60);
      local_128 = local_128 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x60) + 8);
      local_150 = local_150 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x80) + 0x10);
      local_158 = local_158 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0xa0);
      local_f0 = local_f0 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x60) + 0x18);
      local_160 = local_160 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x80);
      local_140 = local_140 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x80) + 0x18);
    }
    else if (laneCount < 0x10) {
      if (laneCount < 8) {
        if (laneCount < 4) {
          if (laneCount < 2) {
            if (laneCount != 0) {
              auVar41 = vpblendd_avx2(auVar41,ZEXT832(auVar41._0_8_ ^
                                                      *(ulong *)*(undefined1 (*) [32])data),3);
            }
          }
          else {
            auVar41 = vpblendd_avx2(auVar41,ZEXT1632(auVar41._0_16_ ^
                                                     *(undefined1 (*) [16])
                                                      *(undefined1 (*) [32])data),0xf);
            if (laneCount == 3) {
              auVar40 = vpbroadcastq_avx512vl();
              auVar41 = vpblendd_avx2(auVar41,auVar40,0x30);
            }
          }
        }
        else {
          auVar41 = auVar41 ^ *(undefined1 (*) [32])data;
          if (laneCount < 6) {
            if (laneCount != 4) {
              local_138 = local_138 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x20);
            }
          }
          else {
            local_138 = local_138 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x20);
            local_d0 = local_d0 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x20) + 8);
            if (laneCount == 7) {
              local_148 = local_148 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x20) + 0x10);
            }
          }
        }
      }
      else {
        auVar41 = auVar41 ^ *(undefined1 (*) [32])data;
        local_138 = local_138 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x20);
        local_d0 = local_d0 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x20) + 8);
        local_148 = local_148 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x20) + 0x10);
        local_f8 = local_f8 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x20) + 0x18);
        if (laneCount < 0xc) {
          if (laneCount < 10) {
            if (laneCount != 8) {
              local_118 = local_118 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x40);
            }
          }
          else {
            local_c8 = local_c8 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x40) + 8);
            local_118 = local_118 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x40);
            if (laneCount == 0xb) {
              local_108 = local_108 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x40) + 0x10);
            }
          }
        }
        else {
          local_c8 = local_c8 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x40) + 8);
          local_108 = local_108 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x40) + 0x10);
          local_118 = local_118 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x40);
          local_e8 = local_e8 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x40) + 0x18);
          if (laneCount < 0xe) {
            if (laneCount != 0xc) {
              local_e0 = local_e0 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x60);
            }
          }
          else {
            local_e0 = local_e0 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x60);
            local_128 = local_128 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x60) + 8);
            if (laneCount == 0xf) {
              local_120 = local_120 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x60) + 0x10);
            }
          }
        }
      }
    }
    else {
      auVar41 = auVar41 ^ *(undefined1 (*) [32])data;
      local_c8 = local_c8 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x40) + 8);
      local_138 = local_138 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x20);
      local_d0 = local_d0 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x20) + 8);
      local_f8 = local_f8 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x20) + 0x18);
      local_108 = local_108 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x40) + 0x10);
      local_e0 = local_e0 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x60);
      local_128 = local_128 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x60) + 8);
      local_e8 = local_e8 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x40) + 0x18);
      local_118 = local_118 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x40);
      local_148 = local_148 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x20) + 0x10);
      local_f0 = local_f0 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x60) + 0x18);
      local_120 = local_120 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x60) + 0x10);
      if (laneCount < 0x18) {
        if (laneCount < 0x14) {
          if (laneCount < 0x12) {
            if (laneCount != 0x10) {
              local_160 = local_160 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x80);
            }
          }
          else {
            local_160 = local_160 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x80);
            uVar5 = uVar5 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x80) + 8);
            if (laneCount == 0x13) {
              local_150 = local_150 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x80) + 0x10);
            }
          }
        }
        else {
          local_160 = local_160 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x80);
          uVar5 = uVar5 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x80) + 8);
          local_150 = local_150 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x80) + 0x10);
          local_140 = local_140 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x80) + 0x18);
          if (0x15 < laneCount) {
            local_110 = local_110 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0xa0) + 8);
            local_158 = local_158 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0xa0);
            if (laneCount == 0x17) {
              local_130 = local_130 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0xa0) + 0x10);
            }
          }
        }
      }
      else {
        local_160 = local_160 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x80);
        uVar5 = uVar5 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x80) + 8);
        local_140 = local_140 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x80) + 0x18);
        local_150 = local_150 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x80) + 0x10);
        local_110 = local_110 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0xa0) + 8);
        local_130 = local_130 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0xa0) + 0x10);
        local_100 = local_100 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0xa0) + 0x18);
        local_158 = local_158 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0xa0);
        if (laneCount != 0x18) {
          local_d8 = local_d8 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0xc0);
        }
      }
    }
    uVar22 = vpextrq_avx(auVar41._0_16_,1);
    uVar3 = local_e8 ^ local_148 ^ local_160 ^ local_110 ^ uVar22;
    uVar23 = vpextrq_avx(auVar41._16_16_,1);
    uVar27 = local_120 ^ local_c8 ^ local_140 ^ local_d8 ^ local_138;
    uVar10 = local_108 ^ local_d0 ^ local_f0 ^ local_158 ^ auVar41._0_8_;
    uVar8 = local_128 ^ local_118 ^ local_150 ^ local_100 ^ uVar23;
    uVar16 = local_e0 ^ local_f8 ^ uVar5 ^ local_130 ^ auVar41._16_8_;
    uVar6 = (uVar10 >> 0x3f | uVar10 << 1) ^ uVar8;
    uVar8 = (uVar8 >> 0x3f | uVar8 << 1) ^ uVar3;
    uVar4 = (uVar3 >> 0x3f | uVar3 << 1) ^ uVar27;
    uVar28 = (uVar27 >> 0x3f | uVar27 << 1) ^ uVar16;
    uVar27 = auVar41._0_8_ ^ uVar4;
    uVar17 = (local_e0 ^ uVar8) >> 0x15 | (local_e0 ^ uVar8) << 0x2b;
    uVar10 = (uVar16 >> 0x3f | uVar16 << 1) ^ uVar10;
    uVar3 = (local_148 ^ uVar10) >> 0x14 | (local_148 ^ uVar10) << 0x2c;
    uVar32 = uVar27 ^ 0x8000808b ^ ~uVar3 & uVar17;
    uVar37 = (local_150 ^ uVar28) >> 0x2b | (local_150 ^ uVar28) << 0x15;
    uVar16 = (local_d8 ^ uVar6) >> 0x32 | (local_d8 ^ uVar6) << 0xe;
    uVar30 = ~uVar17 & uVar37 ^ uVar3;
    uVar17 = ~uVar37 & uVar16 ^ uVar17;
    uVar11 = ~uVar27 & uVar3 ^ uVar16;
    uVar37 = ~uVar16 & uVar27 ^ uVar37;
    uVar16 = (local_160 ^ uVar10) >> 0x13 | (local_160 ^ uVar10) << 0x2d;
    uVar12 = (uVar23 ^ uVar28) >> 0x24 | (uVar23 ^ uVar28) << 0x1c;
    uVar18 = (local_c8 ^ uVar6) >> 0x2c | (local_c8 ^ uVar6) << 0x14;
    uVar23 = (local_108 ^ uVar4) >> 0x3d | (local_108 ^ uVar4) << 3;
    uVar1 = ~uVar23 & uVar16 ^ uVar18;
    uVar2 = (local_158 ^ uVar4) >> 0x2e | (local_158 ^ uVar4) << 0x12;
    uVar27 = (local_130 ^ uVar8) >> 3 | (local_130 ^ uVar8) << 0x3d;
    uVar3 = ~uVar27 & uVar12 ^ uVar16;
    uVar16 = ~uVar16 & uVar27 ^ uVar23;
    uVar24 = (local_128 ^ uVar28) >> 0x27 | (local_128 ^ uVar28) << 0x19;
    uVar23 = ~uVar18 & uVar23 ^ uVar12;
    uVar27 = ~uVar12 & uVar18 ^ uVar27;
    uVar19 = (local_f8 ^ uVar8) >> 0x3a | (local_f8 ^ uVar8) << 6;
    uVar18 = (local_140 ^ uVar6) >> 0x38 | (local_140 ^ uVar6) << 8;
    uVar12 = (uVar22 ^ uVar10) >> 0x3f | (uVar22 ^ uVar10) << 1;
    uVar22 = ~uVar18 & uVar2 ^ uVar24;
    uVar36 = ~uVar2 & uVar12 ^ uVar18;
    uVar9 = ~uVar19 & uVar24 ^ uVar12;
    uVar2 = ~uVar12 & uVar19 ^ uVar2;
    uVar19 = ~uVar24 & uVar18 ^ uVar19;
    uVar25 = (local_e8 ^ uVar10) >> 0x36 | (local_e8 ^ uVar10) << 10;
    uVar18 = (local_d0 ^ uVar4) >> 0x1c | (local_d0 ^ uVar4) << 0x24;
    uVar12 = (local_138 ^ uVar6) >> 0x25 | (local_138 ^ uVar6) << 0x1b;
    uVar24 = uVar8 ^ auVar41._16_8_;
    uVar38 = (uVar5 ^ uVar8) >> 0x31 | (uVar5 ^ uVar8) << 0xf;
    uVar20 = ~uVar25 & uVar38 ^ uVar18;
    uVar31 = uVar24 >> 2 | uVar24 << 0x3e;
    uVar5 = (local_100 ^ uVar28) >> 8 | (local_100 ^ uVar28) << 0x38;
    uVar24 = ~uVar38 & uVar5 ^ uVar25;
    uVar38 = ~uVar5 & uVar12 ^ uVar38;
    uVar26 = ~uVar18 & uVar25 ^ uVar12;
    uVar5 = ~uVar12 & uVar18 ^ uVar5;
    uVar25 = (uVar4 ^ local_f0) >> 0x17 | (uVar4 ^ local_f0) << 0x29;
    uVar4 = (uVar10 ^ local_110) >> 0x3e | (uVar10 ^ local_110) << 2;
    uVar6 = (uVar6 ^ local_120) >> 0x19 | (uVar6 ^ local_120) << 0x27;
    uVar8 = ~uVar4 & uVar31 ^ uVar25;
    uVar7 = ~uVar25 & uVar4 ^ uVar6;
    uVar18 = (uVar28 ^ local_118) >> 9 | (uVar28 ^ local_118) << 0x37;
    uVar12 = uVar8 ^ uVar37 ^ uVar36 ^ uVar3 ^ uVar38;
    uVar13 = ~uVar6 & uVar25 ^ uVar18;
    uVar29 = ~uVar18 & uVar6 ^ uVar31;
    uVar4 = ~uVar31 & uVar18 ^ uVar4;
    uVar25 = uVar20 ^ uVar19 ^ uVar1 ^ uVar30 ^ uVar13;
    uVar6 = uVar26 ^ uVar23 ^ uVar32 ^ uVar9 ^ uVar29;
    uVar28 = (uVar12 >> 0x3f | uVar12 << 1) ^ uVar25;
    uVar12 = (uVar6 >> 0x3f | uVar6 << 1) ^ uVar12;
    uVar18 = uVar4 ^ uVar12;
    uVar4 = uVar2 ^ uVar27 ^ uVar11 ^ uVar4 ^ uVar5;
    uVar10 = uVar18 >> 0x32 | uVar18 << 0xe;
    uVar18 = uVar7 ^ uVar17 ^ uVar16 ^ uVar24 ^ uVar22;
    uVar31 = (uVar25 >> 0x3f | uVar25 << 1) ^ uVar4;
    uVar33 = (uVar4 >> 0x3f | uVar4 << 1) ^ uVar18;
    uVar29 = uVar29 ^ uVar31;
    uVar6 = (uVar18 >> 0x3f | uVar18 << 1) ^ uVar6;
    uVar38 = uVar38 ^ uVar33;
    uVar20 = uVar20 ^ uVar6;
    uVar32 = uVar32 ^ uVar31;
    uVar1 = uVar1 ^ uVar6;
    uVar18 = uVar1 >> 0x14 | uVar1 << 0x2c;
    uVar22 = uVar22 ^ uVar28;
    uVar7 = uVar7 ^ uVar28;
    uVar1 = uVar22 >> 0x15 | uVar22 << 0x2b;
    uVar14 = uVar32 ^ 0x800000000000008b ^ ~uVar18 & uVar1;
    uVar25 = uVar38 >> 0x2b | uVar38 << 0x15;
    uVar38 = ~uVar25 & uVar10 ^ uVar1;
    uVar4 = ~uVar1 & uVar25 ^ uVar18;
    uVar22 = uVar7 >> 3 | uVar7 << 0x3d;
    uVar18 = ~uVar32 & uVar18 ^ uVar10;
    uVar25 = ~uVar10 & uVar32 ^ uVar25;
    uVar7 = uVar20 >> 0x13 | uVar20 << 0x2d;
    uVar37 = uVar37 ^ uVar33;
    uVar27 = uVar27 ^ uVar12;
    uVar1 = uVar37 >> 0x24 | uVar37 << 0x1c;
    uVar27 = uVar27 >> 0x2c | uVar27 << 0x14;
    uVar21 = ~uVar22 & uVar1 ^ uVar7;
    uVar9 = uVar9 ^ uVar31;
    uVar37 = uVar9 >> 0x3d | uVar9 << 3;
    uVar10 = ~uVar7 & uVar22 ^ uVar37;
    uVar32 = ~uVar37 & uVar7 ^ uVar27;
    uVar37 = ~uVar27 & uVar37 ^ uVar1;
    uVar22 = ~uVar1 & uVar27 ^ uVar22;
    uVar1 = uVar29 >> 0x2e | uVar29 << 0x12;
    uVar30 = uVar30 ^ uVar6;
    uVar5 = uVar5 ^ uVar12;
    uVar27 = uVar30 >> 0x3f | uVar30 << 1;
    uVar36 = uVar36 ^ uVar33;
    uVar9 = uVar5 >> 0x38 | uVar5 << 8;
    uVar30 = uVar36 >> 0x27 | uVar36 << 0x19;
    uVar36 = ~uVar1 & uVar27 ^ uVar9;
    uVar20 = ~uVar9 & uVar1 ^ uVar30;
    uVar16 = uVar16 ^ uVar28;
    uVar5 = uVar16 >> 0x3a | uVar16 << 6;
    uVar7 = ~uVar30 & uVar9 ^ uVar5;
    uVar29 = ~uVar5 & uVar30 ^ uVar27;
    uVar1 = ~uVar27 & uVar5 ^ uVar1;
    uVar11 = uVar11 ^ uVar12;
    uVar12 = uVar12 ^ uVar2;
    uVar9 = uVar11 >> 0x25 | uVar11 << 0x1b;
    uVar23 = uVar23 ^ uVar31;
    uVar31 = uVar31 ^ uVar26;
    uVar30 = uVar23 >> 0x1c | uVar23 << 0x24;
    uVar19 = uVar19 ^ uVar6;
    uVar6 = uVar6 ^ uVar13;
    uVar23 = uVar19 >> 0x36 | uVar19 << 10;
    uVar5 = ~uVar30 & uVar23 ^ uVar9;
    uVar24 = uVar24 ^ uVar28;
    uVar28 = uVar28 ^ uVar17;
    uVar27 = uVar24 >> 0x31 | uVar24 << 0xf;
    uVar16 = ~uVar23 & uVar27 ^ uVar30;
    uVar8 = uVar8 ^ uVar33;
    uVar33 = uVar33 ^ uVar3;
    uVar8 = uVar8 >> 8 | uVar8 << 0x38;
    uVar23 = ~uVar27 & uVar8 ^ uVar23;
    uVar27 = ~uVar8 & uVar9 ^ uVar27;
    uVar11 = uVar12 >> 0x19 | uVar12 << 0x27;
    uVar2 = uVar6 >> 0x3e | uVar6 << 2;
    uVar8 = ~uVar9 & uVar30 ^ uVar8;
    uVar12 = uVar28 >> 2 | uVar28 << 0x3e;
    uVar24 = uVar31 >> 0x17 | uVar31 << 0x29;
    uVar31 = ~uVar2 & uVar12 ^ uVar24;
    uVar3 = ~uVar24 & uVar2 ^ uVar11;
    uVar6 = uVar20 ^ uVar23 ^ uVar38 ^ uVar10 ^ uVar3;
    uVar13 = uVar36 ^ uVar27 ^ uVar25 ^ uVar21 ^ uVar31;
    uVar17 = uVar33 >> 9 | uVar33 << 0x37;
    uVar34 = ~uVar11 & uVar24 ^ uVar17;
    uVar33 = ~uVar17 & uVar11 ^ uVar12;
    uVar24 = uVar7 ^ uVar16 ^ uVar4 ^ uVar32 ^ uVar34;
    uVar2 = ~uVar12 & uVar17 ^ uVar2;
    uVar19 = uVar29 ^ uVar5 ^ uVar14 ^ uVar37 ^ uVar33;
    uVar35 = (uVar13 >> 0x3f | uVar13 << 1) ^ uVar24;
    uVar12 = uVar1 ^ uVar8 ^ uVar18 ^ uVar22 ^ uVar2;
    uVar3 = uVar3 ^ uVar35;
    uVar28 = (uVar24 >> 0x3f | uVar24 << 1) ^ uVar12;
    uVar13 = (uVar19 >> 0x3f | uVar19 << 1) ^ uVar13;
    uVar3 = uVar3 >> 3 | uVar3 << 0x3d;
    uVar26 = (uVar12 >> 0x3f | uVar12 << 1) ^ uVar6;
    uVar2 = uVar2 ^ uVar13;
    uVar33 = uVar33 ^ uVar28;
    uVar19 = (uVar6 >> 0x3f | uVar6 << 1) ^ uVar19;
    uVar27 = uVar27 ^ uVar26;
    uVar9 = uVar2 >> 0x32 | uVar2 << 0xe;
    uVar17 = uVar27 >> 0x2b | uVar27 << 0x15;
    uVar32 = uVar32 ^ uVar19;
    uVar14 = uVar14 ^ uVar28;
    uVar12 = uVar32 >> 0x14 | uVar32 << 0x2c;
    uVar20 = uVar20 ^ uVar35;
    uVar27 = uVar20 >> 0x15 | uVar20 << 0x2b;
    uVar30 = uVar14 ^ 0x8000000000008089 ^ ~uVar12 & uVar27;
    uVar32 = ~uVar17 & uVar9 ^ uVar27;
    uVar2 = ~uVar27 & uVar17 ^ uVar12;
    uVar17 = ~uVar9 & uVar14 ^ uVar17;
    uVar9 = ~uVar14 & uVar12 ^ uVar9;
    uVar25 = uVar25 ^ uVar26;
    uVar16 = uVar16 ^ uVar19;
    uVar8 = uVar8 ^ uVar13;
    uVar27 = uVar25 >> 0x24 | uVar25 << 0x1c;
    uVar24 = uVar16 >> 0x13 | uVar16 << 0x2d;
    uVar29 = uVar29 ^ uVar28;
    uVar11 = uVar29 >> 0x3d | uVar29 << 3;
    uVar29 = ~uVar3 & uVar27 ^ uVar24;
    uVar16 = uVar33 >> 0x2e | uVar33 << 0x12;
    uVar6 = ~uVar24 & uVar3 ^ uVar11;
    uVar22 = uVar22 ^ uVar13;
    uVar12 = uVar22 >> 0x2c | uVar22 << 0x14;
    uVar24 = ~uVar11 & uVar24 ^ uVar12;
    uVar25 = ~uVar12 & uVar11 ^ uVar27;
    uVar3 = ~uVar27 & uVar12 ^ uVar3;
    uVar22 = uVar8 >> 0x38 | uVar8 << 8;
    uVar36 = uVar36 ^ uVar26;
    uVar4 = uVar4 ^ uVar19;
    uVar12 = uVar36 >> 0x27 | uVar36 << 0x19;
    uVar10 = uVar10 ^ uVar35;
    uVar8 = uVar4 >> 0x3f | uVar4 << 1;
    uVar20 = ~uVar22 & uVar16 ^ uVar12;
    uVar27 = uVar10 >> 0x3a | uVar10 << 6;
    uVar11 = ~uVar16 & uVar8 ^ uVar22;
    uVar33 = ~uVar12 & uVar22 ^ uVar27;
    uVar4 = ~uVar27 & uVar12 ^ uVar8;
    uVar16 = ~uVar8 & uVar27 ^ uVar16;
    uVar37 = uVar37 ^ uVar28;
    uVar28 = uVar28 ^ uVar5;
    uVar12 = uVar37 >> 0x1c | uVar37 << 0x24;
    uVar18 = uVar18 ^ uVar13;
    uVar23 = uVar23 ^ uVar35;
    uVar35 = uVar35 ^ uVar38;
    uVar13 = uVar13 ^ uVar1;
    uVar18 = uVar18 >> 0x25 | uVar18 << 0x1b;
    uVar7 = uVar7 ^ uVar19;
    uVar19 = uVar19 ^ uVar34;
    uVar22 = uVar7 >> 0x36 | uVar7 << 10;
    uVar5 = ~uVar12 & uVar22 ^ uVar18;
    uVar8 = uVar23 >> 0x31 | uVar23 << 0xf;
    uVar27 = uVar19 >> 0x3e | uVar19 << 2;
    uVar36 = ~uVar22 & uVar8 ^ uVar12;
    uVar31 = uVar31 ^ uVar26;
    uVar26 = uVar26 ^ uVar21;
    uVar1 = uVar31 >> 8 | uVar31 << 0x38;
    uVar22 = ~uVar8 & uVar1 ^ uVar22;
    uVar8 = ~uVar1 & uVar18 ^ uVar8;
    uVar1 = ~uVar18 & uVar12 ^ uVar1;
    uVar12 = uVar26 >> 9 | uVar26 << 0x37;
    uVar18 = uVar13 >> 0x19 | uVar13 << 0x27;
    uVar19 = uVar28 >> 0x17 | uVar28 << 0x29;
    uVar23 = uVar35 >> 2 | uVar35 << 0x3e;
    uVar26 = ~uVar18 & uVar19 ^ uVar12;
    uVar37 = ~uVar27 & uVar23 ^ uVar19;
    uVar31 = uVar33 ^ uVar36 ^ uVar2 ^ uVar24 ^ uVar26;
    uVar10 = uVar11 ^ uVar8 ^ uVar17 ^ uVar29 ^ uVar37;
    uVar28 = ~uVar19 & uVar27 ^ uVar18;
    uVar7 = ~uVar12 & uVar18 ^ uVar23;
    uVar38 = (uVar10 >> 0x3f | uVar10 << 1) ^ uVar31;
    uVar19 = uVar20 ^ uVar22 ^ uVar32 ^ uVar6 ^ uVar28;
    uVar18 = uVar4 ^ uVar5 ^ uVar30 ^ uVar25 ^ uVar7;
    uVar27 = ~uVar23 & uVar12 ^ uVar27;
    uVar20 = uVar20 ^ uVar38;
    uVar28 = uVar28 ^ uVar38;
    uVar21 = (uVar19 >> 0x3f | uVar19 << 1) ^ uVar18;
    uVar23 = uVar16 ^ uVar1 ^ uVar9 ^ uVar3 ^ uVar27;
    uVar12 = uVar28 >> 3 | uVar28 << 0x3d;
    uVar10 = (uVar18 >> 0x3f | uVar18 << 1) ^ uVar10;
    uVar28 = (uVar31 >> 0x3f | uVar31 << 1) ^ uVar23;
    uVar19 = (uVar23 >> 0x3f | uVar23 << 1) ^ uVar19;
    uVar27 = uVar27 ^ uVar10;
    uVar7 = uVar7 ^ uVar28;
    uVar8 = uVar8 ^ uVar19;
    uVar23 = uVar27 >> 0x32 | uVar27 << 0xe;
    uVar27 = uVar8 >> 0x2b | uVar8 << 0x15;
    uVar30 = uVar30 ^ uVar28;
    uVar24 = uVar24 ^ uVar21;
    uVar8 = uVar24 >> 0x14 | uVar24 << 0x2c;
    uVar18 = uVar20 >> 0x15 | uVar20 << 0x2b;
    uVar31 = uVar30 ^ 0x8000000000008003 ^ ~uVar8 & uVar18;
    uVar20 = ~uVar27 & uVar23 ^ uVar18;
    uVar18 = ~uVar18 & uVar27 ^ uVar8;
    uVar24 = ~uVar30 & uVar8 ^ uVar23;
    uVar27 = ~uVar23 & uVar30 ^ uVar27;
    uVar36 = uVar36 ^ uVar21;
    uVar23 = uVar36 >> 0x13 | uVar36 << 0x2d;
    uVar4 = uVar4 ^ uVar28;
    uVar17 = uVar17 ^ uVar19;
    uVar4 = uVar4 >> 0x3d | uVar4 << 3;
    uVar8 = uVar17 >> 0x24 | uVar17 << 0x1c;
    uVar30 = ~uVar23 & uVar12 ^ uVar4;
    uVar13 = ~uVar12 & uVar8 ^ uVar23;
    uVar3 = uVar3 ^ uVar10;
    uVar3 = uVar3 >> 0x2c | uVar3 << 0x14;
    uVar23 = ~uVar4 & uVar23 ^ uVar3;
    uVar1 = uVar1 ^ uVar10;
    uVar36 = ~uVar3 & uVar4 ^ uVar8;
    uVar14 = uVar1 >> 0x38 | uVar1 << 8;
    uVar12 = ~uVar8 & uVar3 ^ uVar12;
    uVar4 = uVar7 >> 0x2e | uVar7 << 0x12;
    uVar6 = uVar6 ^ uVar38;
    uVar11 = uVar11 ^ uVar19;
    uVar3 = uVar6 >> 0x3a | uVar6 << 6;
    uVar2 = uVar2 ^ uVar21;
    uVar1 = uVar11 >> 0x27 | uVar11 << 0x19;
    uVar8 = uVar2 >> 0x3f | uVar2 << 1;
    uVar2 = ~uVar14 & uVar4 ^ uVar1;
    uVar6 = ~uVar3 & uVar1 ^ uVar8;
    uVar7 = ~uVar1 & uVar14 ^ uVar3;
    uVar3 = ~uVar8 & uVar3 ^ uVar4;
    uVar14 = ~uVar4 & uVar8 ^ uVar14;
    uVar33 = uVar33 ^ uVar21;
    uVar9 = uVar9 ^ uVar10;
    uVar8 = uVar33 >> 0x36 | uVar33 << 10;
    uVar10 = uVar10 ^ uVar16;
    uVar1 = uVar9 >> 0x25 | uVar9 << 0x1b;
    uVar25 = uVar25 ^ uVar28;
    uVar17 = uVar25 >> 0x1c | uVar25 << 0x24;
    uVar4 = ~uVar17 & uVar8 ^ uVar1;
    uVar22 = uVar22 ^ uVar38;
    uVar38 = uVar38 ^ uVar32;
    uVar16 = uVar22 >> 0x31 | uVar22 << 0xf;
    uVar25 = ~uVar8 & uVar16 ^ uVar17;
    uVar37 = uVar37 ^ uVar19;
    uVar9 = uVar37 >> 8 | uVar37 << 0x38;
    uVar37 = uVar38 >> 2 | uVar38 << 0x3e;
    uVar8 = ~uVar16 & uVar9 ^ uVar8;
    uVar16 = ~uVar9 & uVar1 ^ uVar16;
    uVar9 = ~uVar1 & uVar17 ^ uVar9;
    uVar19 = uVar19 ^ uVar29;
    uVar21 = uVar21 ^ uVar26;
    uVar28 = uVar28 ^ uVar5;
    uVar5 = uVar19 >> 9 | uVar19 << 0x37;
    uVar1 = uVar10 >> 0x19 | uVar10 << 0x27;
    uVar10 = uVar21 >> 0x3e | uVar21 << 2;
    uVar22 = uVar28 >> 0x17 | uVar28 << 0x29;
    uVar28 = ~uVar10 & uVar37 ^ uVar22;
    uVar26 = ~uVar22 & uVar10 ^ uVar1;
    uVar32 = ~uVar1 & uVar22 ^ uVar5;
    uVar17 = uVar14 ^ uVar16 ^ uVar27 ^ uVar13 ^ uVar28;
    uVar10 = ~uVar37 & uVar5 ^ uVar10;
    uVar37 = ~uVar5 & uVar1 ^ uVar37;
    uVar1 = uVar7 ^ uVar25 ^ uVar18 ^ uVar23 ^ uVar32;
    uVar38 = uVar2 ^ uVar8 ^ uVar20 ^ uVar30 ^ uVar26;
    uVar5 = uVar3 ^ uVar9 ^ uVar24 ^ uVar12 ^ uVar10;
    uVar22 = uVar6 ^ uVar4 ^ uVar31 ^ uVar36 ^ uVar37;
    uVar29 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar1;
    uVar35 = (uVar38 >> 0x3f | uVar38 << 1) ^ uVar22;
    uVar1 = (uVar1 >> 0x3f | uVar1 << 1) ^ uVar5;
    uVar38 = (uVar5 >> 0x3f | uVar5 << 1) ^ uVar38;
    uVar26 = uVar26 ^ uVar29;
    uVar17 = (uVar22 >> 0x3f | uVar22 << 1) ^ uVar17;
    uVar16 = uVar16 ^ uVar38;
    uVar10 = uVar10 ^ uVar17;
    uVar6 = uVar6 ^ uVar1;
    uVar21 = uVar10 >> 0x32 | uVar10 << 0xe;
    uVar31 = uVar31 ^ uVar1;
    uVar23 = uVar23 ^ uVar35;
    uVar5 = uVar23 >> 0x14 | uVar23 << 0x2c;
    uVar2 = uVar2 ^ uVar29;
    uVar23 = uVar2 >> 0x15 | uVar2 << 0x2b;
    uVar11 = uVar31 ^ 0x8000000000008002 ^ ~uVar5 & uVar23;
    uVar22 = uVar16 >> 0x2b | uVar16 << 0x15;
    uVar19 = ~uVar22 & uVar21 ^ uVar23;
    uVar10 = ~uVar23 & uVar22 ^ uVar5;
    uVar5 = ~uVar31 & uVar5 ^ uVar21;
    uVar6 = uVar6 >> 0x3d | uVar6 << 3;
    uVar23 = uVar26 >> 3 | uVar26 << 0x3d;
    uVar22 = ~uVar21 & uVar31 ^ uVar22;
    uVar37 = uVar37 ^ uVar1;
    uVar2 = uVar37 >> 0x2e | uVar37 << 0x12;
    uVar12 = uVar12 ^ uVar17;
    uVar12 = uVar12 >> 0x2c | uVar12 << 0x14;
    uVar27 = uVar27 ^ uVar38;
    uVar16 = uVar27 >> 0x24 | uVar27 << 0x1c;
    uVar25 = uVar25 ^ uVar35;
    uVar37 = uVar25 >> 0x13 | uVar25 << 0x2d;
    uVar25 = ~uVar23 & uVar16 ^ uVar37;
    uVar27 = ~uVar6 & uVar37 ^ uVar12;
    uVar37 = ~uVar37 & uVar23 ^ uVar6;
    uVar6 = ~uVar12 & uVar6 ^ uVar16;
    uVar23 = ~uVar16 & uVar12 ^ uVar23;
    uVar14 = uVar14 ^ uVar38;
    uVar30 = uVar30 ^ uVar29;
    uVar21 = uVar14 >> 0x27 | uVar14 << 0x19;
    uVar18 = uVar18 ^ uVar35;
    uVar12 = uVar30 >> 0x3a | uVar30 << 6;
    uVar16 = uVar18 >> 0x3f | uVar18 << 1;
    uVar9 = uVar9 ^ uVar17;
    uVar18 = uVar9 >> 0x38 | uVar9 << 8;
    uVar14 = ~uVar2 & uVar16 ^ uVar18;
    uVar26 = ~uVar18 & uVar2 ^ uVar21;
    uVar31 = ~uVar21 & uVar18 ^ uVar12;
    uVar33 = ~uVar12 & uVar21 ^ uVar16;
    uVar2 = ~uVar16 & uVar12 ^ uVar2;
    uVar36 = uVar36 ^ uVar1;
    uVar12 = uVar36 >> 0x1c | uVar36 << 0x24;
    uVar24 = uVar24 ^ uVar17;
    uVar17 = uVar17 ^ uVar3;
    uVar16 = uVar24 >> 0x25 | uVar24 << 0x1b;
    uVar7 = uVar7 ^ uVar35;
    uVar35 = uVar35 ^ uVar32;
    uVar3 = uVar7 >> 0x36 | uVar7 << 10;
    uVar36 = ~uVar12 & uVar3 ^ uVar16;
    uVar8 = uVar8 ^ uVar29;
    uVar29 = uVar29 ^ uVar20;
    uVar34 = uVar8 >> 0x31 | uVar8 << 0xf;
    uVar9 = ~uVar3 & uVar34 ^ uVar12;
    uVar28 = uVar28 ^ uVar38;
    uVar38 = uVar38 ^ uVar13;
    uVar30 = uVar28 >> 8 | uVar28 << 0x38;
    uVar3 = ~uVar34 & uVar30 ^ uVar3;
    uVar34 = ~uVar30 & uVar16 ^ uVar34;
    uVar1 = uVar1 ^ uVar4;
    uVar24 = uVar29 >> 2 | uVar29 << 0x3e;
    uVar7 = uVar35 >> 0x3e | uVar35 << 2;
    uVar30 = ~uVar16 & uVar12 ^ uVar30;
    uVar16 = uVar38 >> 9 | uVar38 << 0x37;
    uVar12 = uVar17 >> 0x19 | uVar17 << 0x27;
    uVar18 = uVar1 >> 0x17 | uVar1 << 0x29;
    uVar8 = ~uVar7 & uVar24 ^ uVar18;
    uVar1 = ~uVar18 & uVar7 ^ uVar12;
    uVar35 = ~uVar12 & uVar18 ^ uVar16;
    uVar38 = uVar14 ^ uVar34 ^ uVar22 ^ uVar25 ^ uVar8;
    uVar18 = ~uVar16 & uVar12 ^ uVar24;
    uVar21 = uVar26 ^ uVar3 ^ uVar19 ^ uVar37 ^ uVar1;
    uVar12 = uVar31 ^ uVar9 ^ uVar10 ^ uVar27 ^ uVar35;
    uVar4 = uVar33 ^ uVar36 ^ uVar11 ^ uVar6 ^ uVar18;
    uVar7 = ~uVar24 & uVar16 ^ uVar7;
    uVar20 = (uVar38 >> 0x3f | uVar38 << 1) ^ uVar12;
    uVar29 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar4;
    uVar16 = uVar2 ^ uVar30 ^ uVar5 ^ uVar23 ^ uVar7;
    uVar26 = uVar26 ^ uVar20;
    uVar1 = uVar1 ^ uVar20;
    uVar38 = (uVar4 >> 0x3f | uVar4 << 1) ^ uVar38;
    uVar32 = (uVar12 >> 0x3f | uVar12 << 1) ^ uVar16;
    uVar12 = uVar1 >> 3 | uVar1 << 0x3d;
    uVar27 = uVar27 ^ uVar29;
    uVar21 = (uVar16 >> 0x3f | uVar16 << 1) ^ uVar21;
    uVar7 = uVar7 ^ uVar38;
    uVar18 = uVar18 ^ uVar32;
    uVar1 = uVar27 >> 0x14 | uVar27 << 0x2c;
    uVar16 = uVar26 >> 0x15 | uVar26 << 0x2b;
    uVar34 = uVar34 ^ uVar21;
    uVar18 = uVar18 >> 0x2e | uVar18 << 0x12;
    uVar27 = uVar34 >> 0x2b | uVar34 << 0x15;
    uVar11 = uVar11 ^ uVar32;
    uVar4 = uVar11 ^ 0x8000000000000080 ^ ~uVar1 & uVar16;
    uVar28 = uVar7 >> 0x32 | uVar7 << 0xe;
    uVar24 = ~uVar28 & uVar11 ^ uVar27;
    uVar39 = ~uVar27 & uVar28 ^ uVar16;
    uVar16 = ~uVar16 & uVar27 ^ uVar1;
    uVar28 = ~uVar11 & uVar1 ^ uVar28;
    uVar33 = uVar33 ^ uVar32;
    uVar17 = uVar33 >> 0x3d | uVar33 << 3;
    uVar22 = uVar22 ^ uVar21;
    uVar23 = uVar23 ^ uVar38;
    uVar27 = uVar22 >> 0x24 | uVar22 << 0x1c;
    uVar23 = uVar23 >> 0x2c | uVar23 << 0x14;
    uVar9 = uVar9 ^ uVar29;
    uVar1 = uVar9 >> 0x13 | uVar9 << 0x2d;
    uVar34 = ~uVar12 & uVar27 ^ uVar1;
    uVar9 = ~uVar1 & uVar12 ^ uVar17;
    uVar1 = ~uVar17 & uVar1 ^ uVar23;
    uVar22 = ~uVar23 & uVar17 ^ uVar27;
    uVar12 = ~uVar27 & uVar23 ^ uVar12;
    uVar30 = uVar30 ^ uVar38;
    uVar10 = uVar10 ^ uVar29;
    uVar14 = uVar14 ^ uVar21;
    uVar30 = uVar30 >> 0x38 | uVar30 << 8;
    uVar23 = uVar10 >> 0x3f | uVar10 << 1;
    uVar17 = uVar14 >> 0x27 | uVar14 << 0x19;
    uVar26 = ~uVar30 & uVar18 ^ uVar17;
    uVar7 = ~uVar18 & uVar23 ^ uVar30;
    uVar37 = uVar37 ^ uVar20;
    uVar27 = uVar37 >> 0x3a | uVar37 << 6;
    uVar30 = ~uVar17 & uVar30 ^ uVar27;
    uVar13 = ~uVar27 & uVar17 ^ uVar23;
    uVar18 = ~uVar23 & uVar27 ^ uVar18;
    uVar5 = uVar5 ^ uVar38;
    uVar38 = uVar38 ^ uVar2;
    uVar23 = uVar5 >> 0x25 | uVar5 << 0x1b;
    uVar27 = uVar38 >> 0x19 | uVar38 << 0x27;
    uVar31 = uVar31 ^ uVar29;
    uVar6 = uVar6 ^ uVar32;
    uVar29 = uVar29 ^ uVar35;
    uVar17 = uVar6 >> 0x1c | uVar6 << 0x24;
    uVar11 = uVar31 >> 0x36 | uVar31 << 10;
    uVar2 = ~uVar17 & uVar11 ^ uVar23;
    uVar3 = uVar3 ^ uVar20;
    uVar20 = uVar20 ^ uVar19;
    uVar3 = uVar3 >> 0x31 | uVar3 << 0xf;
    uVar14 = ~uVar11 & uVar3 ^ uVar17;
    uVar8 = uVar8 ^ uVar21;
    uVar21 = uVar21 ^ uVar25;
    uVar5 = uVar8 >> 8 | uVar8 << 0x38;
    uVar11 = ~uVar3 & uVar5 ^ uVar11;
    uVar6 = uVar20 >> 2 | uVar20 << 0x3e;
    uVar38 = ~uVar23 & uVar17 ^ uVar5;
    uVar3 = ~uVar5 & uVar23 ^ uVar3;
    uVar5 = uVar21 >> 9 | uVar21 << 0x37;
    uVar32 = uVar32 ^ uVar36;
    uVar20 = ~uVar5 & uVar27 ^ uVar6;
    uVar25 = uVar13 ^ uVar2 ^ uVar4 ^ uVar22 ^ uVar20;
    uVar23 = uVar32 >> 0x17 | uVar32 << 0x29;
    uVar8 = uVar29 >> 0x3e | uVar29 << 2;
    uVar10 = ~uVar8 & uVar6 ^ uVar23;
    uVar21 = ~uVar27 & uVar23 ^ uVar5;
    uVar27 = ~uVar23 & uVar8 ^ uVar27;
    uVar17 = uVar7 ^ uVar3 ^ uVar24 ^ uVar34 ^ uVar10;
    uVar23 = uVar30 ^ uVar14 ^ uVar16 ^ uVar1 ^ uVar21;
    uVar8 = ~uVar6 & uVar5 ^ uVar8;
    uVar6 = uVar26 ^ uVar11 ^ uVar39 ^ uVar9 ^ uVar27;
    uVar35 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar23;
    uVar5 = uVar18 ^ uVar38 ^ uVar28 ^ uVar12 ^ uVar8;
    uVar17 = (uVar25 >> 0x3f | uVar25 << 1) ^ uVar17;
    uVar33 = (uVar23 >> 0x3f | uVar23 << 1) ^ uVar5;
    uVar8 = uVar8 ^ uVar17;
    uVar27 = uVar27 ^ uVar35;
    uVar32 = (uVar5 >> 0x3f | uVar5 << 1) ^ uVar6;
    uVar8 = uVar8 >> 0x32 | uVar8 << 0xe;
    uVar23 = uVar27 >> 3 | uVar27 << 0x3d;
    uVar20 = uVar20 ^ uVar33;
    uVar3 = uVar3 ^ uVar32;
    uVar26 = uVar26 ^ uVar35;
    uVar4 = uVar4 ^ uVar33;
    uVar25 = (uVar6 >> 0x3f | uVar6 << 1) ^ uVar25;
    uVar6 = uVar26 >> 0x15 | uVar26 << 0x2b;
    uVar3 = uVar3 >> 0x2b | uVar3 << 0x15;
    uVar1 = uVar1 ^ uVar25;
    uVar31 = ~uVar8 & uVar4 ^ uVar3;
    uVar5 = uVar1 >> 0x14 | uVar1 << 0x2c;
    uVar19 = ~uVar3 & uVar8 ^ uVar6;
    uVar37 = ~uVar6 & uVar3 ^ uVar5;
    uVar8 = ~uVar4 & uVar5 ^ uVar8;
    uVar13 = uVar13 ^ uVar33;
    uVar27 = uVar13 >> 0x3d | uVar13 << 3;
    uVar24 = uVar24 ^ uVar32;
    uVar12 = uVar12 ^ uVar17;
    uVar3 = uVar24 >> 0x24 | uVar24 << 0x1c;
    uVar12 = uVar12 >> 0x2c | uVar12 << 0x14;
    uVar14 = uVar14 ^ uVar25;
    uVar1 = uVar14 >> 0x13 | uVar14 << 0x2d;
    uVar13 = ~uVar23 & uVar3 ^ uVar1;
    uVar36 = ~uVar1 & uVar23 ^ uVar27;
    uVar29 = ~uVar27 & uVar1 ^ uVar12;
    uVar24 = ~uVar12 & uVar27 ^ uVar3;
    uVar23 = ~uVar3 & uVar12 ^ uVar23;
    uVar27 = uVar20 >> 0x2e | uVar20 << 0x12;
    uVar38 = uVar38 ^ uVar17;
    uVar7 = uVar7 ^ uVar32;
    uVar16 = uVar16 ^ uVar25;
    uVar20 = uVar38 >> 0x38 | uVar38 << 8;
    uVar12 = uVar7 >> 0x27 | uVar7 << 0x19;
    uVar3 = uVar16 >> 0x3f | uVar16 << 1;
    uVar7 = ~uVar27 & uVar3 ^ uVar20;
    uVar1 = ~uVar20 & uVar27 ^ uVar12;
    uVar9 = uVar9 ^ uVar35;
    uVar16 = uVar9 >> 0x3a | uVar9 << 6;
    uVar14 = ~uVar12 & uVar20 ^ uVar16;
    uVar9 = ~uVar16 & uVar12 ^ uVar3;
    uVar27 = ~uVar3 & uVar16 ^ uVar27;
    uVar30 = uVar30 ^ uVar25;
    uVar22 = uVar22 ^ uVar33;
    uVar20 = uVar30 >> 0x36 | uVar30 << 10;
    uVar33 = uVar33 ^ uVar2;
    uVar2 = uVar22 >> 0x1c | uVar22 << 0x24;
    uVar30 = ~uVar5 & uVar6 ^ uVar4 ^ 0x800a;
    uVar10 = uVar10 ^ uVar32;
    uVar32 = uVar32 ^ uVar34;
    uVar11 = uVar11 ^ uVar35;
    uVar4 = uVar10 >> 8 | uVar10 << 0x38;
    uVar35 = uVar35 ^ uVar39;
    uVar22 = uVar11 >> 0x31 | uVar11 << 0xf;
    uVar5 = ~uVar20 & uVar22 ^ uVar2;
    uVar3 = ~uVar22 & uVar4 ^ uVar20;
    uVar28 = uVar28 ^ uVar17;
    uVar17 = uVar17 ^ uVar18;
    uVar16 = uVar28 >> 0x25 | uVar28 << 0x1b;
    uVar22 = ~uVar4 & uVar16 ^ uVar22;
    uVar4 = ~uVar16 & uVar2 ^ uVar4;
    uVar18 = uVar35 >> 2 | uVar35 << 0x3e;
    uVar10 = uVar32 >> 9 | uVar32 << 0x37;
    uVar12 = uVar17 >> 0x19 | uVar17 << 0x27;
    uVar16 = ~uVar2 & uVar20 ^ uVar16;
    uVar34 = ~uVar10 & uVar12 ^ uVar18;
    uVar25 = uVar25 ^ uVar21;
    uVar25 = uVar25 >> 0x3e | uVar25 << 2;
    uVar2 = uVar16 ^ uVar34 ^ uVar24 ^ uVar9 ^ uVar30;
    uVar17 = uVar33 >> 0x17 | uVar33 << 0x29;
    uVar11 = ~uVar17 & uVar25 ^ uVar12;
    uVar6 = ~uVar12 & uVar17 ^ uVar10;
    uVar17 = ~uVar25 & uVar18 ^ uVar17;
    uVar25 = ~uVar18 & uVar10 ^ uVar25;
    uVar20 = uVar14 ^ uVar5 ^ uVar37 ^ uVar29 ^ uVar6;
    uVar18 = uVar1 ^ uVar3 ^ uVar19 ^ uVar36 ^ uVar11;
    uVar32 = uVar7 ^ uVar22 ^ uVar31 ^ uVar13 ^ uVar17;
    uVar12 = uVar27 ^ uVar4 ^ uVar8 ^ uVar23 ^ uVar25;
    uVar35 = (uVar20 >> 0x3f | uVar20 << 1) ^ uVar12;
    uVar20 = (uVar32 >> 0x3f | uVar32 << 1) ^ uVar20;
    uVar30 = uVar30 ^ uVar35;
    uVar34 = uVar34 ^ uVar35;
    uVar38 = (uVar12 >> 0x3f | uVar12 << 1) ^ uVar18;
    uVar11 = uVar11 ^ uVar20;
    uVar21 = (uVar18 >> 0x3f | uVar18 << 1) ^ uVar2;
    uVar1 = uVar1 ^ uVar20;
    uVar22 = uVar22 ^ uVar38;
    uVar32 = (uVar2 >> 0x3f | uVar2 << 1) ^ uVar32;
    uVar18 = uVar1 >> 0x15 | uVar1 << 0x2b;
    uVar25 = uVar25 ^ uVar32;
    uVar2 = uVar25 >> 0x32 | uVar25 << 0xe;
    uVar29 = uVar29 ^ uVar21;
    uVar12 = uVar29 >> 0x14 | uVar29 << 0x2c;
    uVar10 = uVar30 ^ 0x800000008000000a ^ ~uVar12 & uVar18;
    uVar1 = uVar22 >> 0x2b | uVar22 << 0x15;
    uVar26 = ~uVar1 & uVar2 ^ uVar18;
    uVar22 = ~uVar18 & uVar1 ^ uVar12;
    uVar12 = ~uVar30 & uVar12 ^ uVar2;
    uVar1 = ~uVar2 & uVar30 ^ uVar1;
    uVar18 = uVar11 >> 3 | uVar11 << 0x3d;
    uVar31 = uVar31 ^ uVar38;
    uVar5 = uVar5 ^ uVar21;
    uVar23 = uVar23 ^ uVar32;
    uVar2 = uVar31 >> 0x24 | uVar31 << 0x1c;
    uVar30 = uVar5 >> 0x13 | uVar5 << 0x2d;
    uVar5 = uVar23 >> 0x2c | uVar23 << 0x14;
    uVar33 = ~uVar18 & uVar2 ^ uVar30;
    uVar9 = uVar9 ^ uVar35;
    uVar23 = uVar9 >> 0x3d | uVar9 << 3;
    uVar28 = ~uVar30 & uVar18 ^ uVar23;
    uVar29 = ~uVar23 & uVar30 ^ uVar5;
    uVar11 = ~uVar5 & uVar23 ^ uVar2;
    uVar18 = ~uVar2 & uVar5 ^ uVar18;
    uVar23 = uVar34 >> 0x2e | uVar34 << 0x12;
    uVar37 = uVar37 ^ uVar21;
    uVar4 = uVar4 ^ uVar32;
    uVar5 = uVar37 >> 0x3f | uVar37 << 1;
    uVar7 = uVar7 ^ uVar38;
    uVar30 = uVar4 >> 0x38 | uVar4 << 8;
    uVar4 = uVar7 >> 0x27 | uVar7 << 0x19;
    uVar31 = ~uVar23 & uVar5 ^ uVar30;
    uVar37 = ~uVar30 & uVar23 ^ uVar4;
    uVar36 = uVar36 ^ uVar20;
    uVar2 = uVar36 >> 0x3a | uVar36 << 6;
    uVar7 = ~uVar4 & uVar30 ^ uVar2;
    uVar30 = ~uVar2 & uVar4 ^ uVar5;
    uVar8 = uVar8 ^ uVar32;
    uVar32 = uVar32 ^ uVar27;
    uVar23 = ~uVar5 & uVar2 ^ uVar23;
    uVar8 = uVar8 >> 0x25 | uVar8 << 0x1b;
    uVar14 = uVar14 ^ uVar21;
    uVar21 = uVar21 ^ uVar6;
    uVar25 = uVar14 >> 0x36 | uVar14 << 10;
    uVar6 = uVar21 >> 0x3e | uVar21 << 2;
    uVar24 = uVar24 ^ uVar35;
    uVar35 = uVar35 ^ uVar16;
    uVar16 = uVar24 >> 0x1c | uVar24 << 0x24;
    uVar4 = ~uVar16 & uVar25 ^ uVar8;
    uVar17 = uVar17 ^ uVar38;
    uVar38 = uVar38 ^ uVar13;
    uVar3 = uVar3 ^ uVar20;
    uVar20 = uVar20 ^ uVar19;
    uVar3 = uVar3 >> 0x31 | uVar3 << 0xf;
    uVar36 = ~uVar25 & uVar3 ^ uVar16;
    uVar5 = uVar17 >> 8 | uVar17 << 0x38;
    uVar25 = ~uVar3 & uVar5 ^ uVar25;
    uVar3 = ~uVar5 & uVar8 ^ uVar3;
    uVar5 = ~uVar8 & uVar16 ^ uVar5;
    uVar16 = uVar32 >> 0x19 | uVar32 << 0x27;
    uVar27 = uVar35 >> 0x17 | uVar35 << 0x29;
    uVar2 = uVar20 >> 2 | uVar20 << 0x3e;
    uVar8 = uVar38 >> 9 | uVar38 << 0x37;
    uVar38 = ~uVar16 & uVar27 ^ uVar8;
    uVar32 = ~uVar6 & uVar2 ^ uVar27;
    uVar34 = ~uVar2 & uVar8 ^ uVar6;
    uVar17 = uVar7 ^ uVar36 ^ uVar22 ^ uVar29 ^ uVar38;
    uVar24 = uVar23 ^ uVar5 ^ uVar12 ^ uVar18 ^ uVar34;
    uVar14 = uVar31 ^ uVar3 ^ uVar1 ^ uVar33 ^ uVar32;
    uVar27 = ~uVar27 & uVar6 ^ uVar16;
    uVar6 = uVar37 ^ uVar25 ^ uVar26 ^ uVar28 ^ uVar27;
    uVar2 = ~uVar8 & uVar16 ^ uVar2;
    uVar8 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar24;
    uVar17 = (uVar14 >> 0x3f | uVar14 << 1) ^ uVar17;
    uVar16 = uVar30 ^ uVar4 ^ uVar10 ^ uVar11 ^ uVar2;
    uVar21 = (uVar24 >> 0x3f | uVar24 << 1) ^ uVar6;
    uVar27 = uVar27 ^ uVar17;
    uVar2 = uVar2 ^ uVar8;
    uVar20 = (uVar6 >> 0x3f | uVar6 << 1) ^ uVar16;
    uVar3 = uVar3 ^ uVar21;
    uVar27 = uVar27 >> 3 | uVar27 << 0x3d;
    uVar2 = uVar2 >> 0x2e | uVar2 << 0x12;
    uVar37 = uVar37 ^ uVar17;
    uVar14 = (uVar16 >> 0x3f | uVar16 << 1) ^ uVar14;
    uVar9 = uVar3 >> 0x2b | uVar3 << 0x15;
    uVar34 = uVar34 ^ uVar14;
    uVar29 = uVar29 ^ uVar20;
    uVar19 = uVar29 >> 0x14 | uVar29 << 0x2c;
    uVar10 = uVar10 ^ uVar8;
    uVar3 = uVar37 >> 0x15 | uVar37 << 0x2b;
    uVar13 = uVar10 ^ 0x8000000080008081 ^ ~uVar19 & uVar3;
    uVar16 = uVar34 >> 0x32 | uVar34 << 0xe;
    uVar6 = ~uVar9 & uVar16 ^ uVar3;
    uVar24 = ~uVar3 & uVar9 ^ uVar19;
    uVar9 = ~uVar16 & uVar10 ^ uVar9;
    uVar16 = ~uVar10 & uVar19 ^ uVar16;
    uVar18 = uVar18 ^ uVar14;
    uVar19 = uVar18 >> 0x2c | uVar18 << 0x14;
    uVar30 = uVar30 ^ uVar8;
    uVar1 = uVar1 ^ uVar21;
    uVar37 = uVar30 >> 0x3d | uVar30 << 3;
    uVar36 = uVar36 ^ uVar20;
    uVar3 = uVar1 >> 0x24 | uVar1 << 0x1c;
    uVar1 = uVar36 >> 0x13 | uVar36 << 0x2d;
    uVar30 = ~uVar27 & uVar3 ^ uVar1;
    uVar18 = ~uVar37 & uVar1 ^ uVar19;
    uVar10 = ~uVar1 & uVar27 ^ uVar37;
    uVar37 = ~uVar19 & uVar37 ^ uVar3;
    uVar27 = ~uVar3 & uVar19 ^ uVar27;
    uVar31 = uVar31 ^ uVar21;
    uVar31 = uVar31 >> 0x27 | uVar31 << 0x19;
    uVar28 = uVar28 ^ uVar17;
    uVar1 = uVar28 >> 0x3a | uVar28 << 6;
    uVar22 = uVar22 ^ uVar20;
    uVar3 = uVar22 >> 0x3f | uVar22 << 1;
    uVar5 = uVar5 ^ uVar14;
    uVar5 = uVar5 >> 0x38 | uVar5 << 8;
    uVar19 = ~uVar2 & uVar3 ^ uVar5;
    uVar29 = ~uVar5 & uVar2 ^ uVar31;
    uVar36 = ~uVar1 & uVar31 ^ uVar3;
    uVar28 = ~uVar31 & uVar5 ^ uVar1;
    uVar2 = ~uVar3 & uVar1 ^ uVar2;
    uVar12 = uVar12 ^ uVar14;
    uVar14 = uVar14 ^ uVar23;
    uVar1 = uVar12 >> 0x25 | uVar12 << 0x1b;
    uVar11 = uVar11 ^ uVar8;
    uVar22 = uVar11 >> 0x1c | uVar11 << 0x24;
    uVar7 = uVar7 ^ uVar20;
    uVar20 = uVar20 ^ uVar38;
    uVar5 = uVar7 >> 0x36 | uVar7 << 10;
    uVar12 = ~uVar22 & uVar5 ^ uVar1;
    uVar25 = uVar25 ^ uVar17;
    uVar23 = uVar25 >> 0x31 | uVar25 << 0xf;
    uVar25 = ~uVar5 & uVar23 ^ uVar22;
    uVar32 = uVar32 ^ uVar21;
    uVar21 = uVar21 ^ uVar33;
    uVar3 = uVar32 >> 8 | uVar32 << 0x38;
    uVar5 = ~uVar23 & uVar3 ^ uVar5;
    uVar32 = ~uVar1 & uVar22 ^ uVar3;
    uVar23 = ~uVar3 & uVar1 ^ uVar23;
    uVar17 = uVar17 ^ uVar26;
    uVar8 = uVar8 ^ uVar4;
    uVar3 = uVar21 >> 9 | uVar21 << 0x37;
    uVar22 = uVar17 >> 2 | uVar17 << 0x3e;
    uVar1 = uVar14 >> 0x19 | uVar14 << 0x27;
    uVar17 = uVar20 >> 0x3e | uVar20 << 2;
    uVar8 = uVar8 >> 0x17 | uVar8 << 0x29;
    uVar20 = ~uVar17 & uVar22 ^ uVar8;
    uVar26 = ~uVar3 & uVar1 ^ uVar22;
    uVar4 = ~uVar22 & uVar3 ^ uVar17;
    uVar22 = uVar19 ^ uVar23 ^ uVar9 ^ uVar30 ^ uVar20;
    uVar7 = ~uVar8 & uVar17 ^ uVar1;
    uVar17 = uVar36 ^ uVar12 ^ uVar13 ^ uVar37 ^ uVar26;
    uVar3 = ~uVar1 & uVar8 ^ uVar3;
    uVar31 = uVar2 ^ uVar32 ^ uVar16 ^ uVar27 ^ uVar4;
    uVar8 = uVar29 ^ uVar5 ^ uVar6 ^ uVar10 ^ uVar7;
    uVar1 = uVar28 ^ uVar25 ^ uVar24 ^ uVar18 ^ uVar3;
    uVar33 = (uVar31 >> 0x3f | uVar31 << 1) ^ uVar8;
    uVar38 = (uVar8 >> 0x3f | uVar8 << 1) ^ uVar17;
    uVar34 = (uVar22 >> 0x3f | uVar22 << 1) ^ uVar1;
    uVar31 = (uVar1 >> 0x3f | uVar1 << 1) ^ uVar31;
    uVar22 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar22;
    uVar23 = uVar23 ^ uVar33;
    uVar7 = uVar7 ^ uVar34;
    uVar4 = uVar4 ^ uVar22;
    uVar11 = uVar23 >> 0x2b | uVar23 << 0x15;
    uVar26 = uVar26 ^ uVar31;
    uVar18 = uVar18 ^ uVar38;
    uVar1 = uVar4 >> 0x32 | uVar4 << 0xe;
    uVar8 = uVar18 >> 0x14 | uVar18 << 0x2c;
    uVar13 = uVar13 ^ uVar31;
    uVar29 = uVar29 ^ uVar34;
    uVar23 = uVar29 >> 0x15 | uVar29 << 0x2b;
    uVar14 = ~uVar11 & uVar1 ^ uVar23;
    uVar4 = ~uVar23 & uVar11 ^ uVar8;
    uVar17 = uVar7 >> 3 | uVar7 << 0x3d;
    uVar7 = uVar13 ^ 0x8000000000008080 ^ ~uVar8 & uVar23;
    uVar11 = ~uVar1 & uVar13 ^ uVar11;
    uVar1 = ~uVar13 & uVar8 ^ uVar1;
    uVar9 = uVar9 ^ uVar33;
    uVar25 = uVar25 ^ uVar38;
    uVar9 = uVar9 >> 0x24 | uVar9 << 0x1c;
    uVar25 = uVar25 >> 0x13 | uVar25 << 0x2d;
    uVar21 = ~uVar17 & uVar9 ^ uVar25;
    uVar27 = uVar27 ^ uVar22;
    uVar18 = uVar27 >> 0x2c | uVar27 << 0x14;
    uVar8 = ~uVar9 & uVar18 ^ uVar17;
    uVar36 = uVar36 ^ uVar31;
    uVar23 = uVar36 >> 0x3d | uVar36 << 3;
    uVar27 = uVar26 >> 0x2e | uVar26 << 0x12;
    uVar17 = ~uVar25 & uVar17 ^ uVar23;
    uVar29 = ~uVar23 & uVar25 ^ uVar18;
    uVar24 = uVar24 ^ uVar38;
    uVar9 = ~uVar18 & uVar23 ^ uVar9;
    uVar23 = uVar24 >> 0x3f | uVar24 << 1;
    uVar10 = uVar10 ^ uVar34;
    uVar18 = uVar10 >> 0x3a | uVar10 << 6;
    uVar32 = uVar32 ^ uVar22;
    uVar32 = uVar32 >> 0x38 | uVar32 << 8;
    uVar25 = ~uVar27 & uVar23 ^ uVar32;
    uVar19 = uVar19 ^ uVar33;
    uVar24 = uVar19 >> 0x27 | uVar19 << 0x19;
    uVar10 = ~uVar32 & uVar27 ^ uVar24;
    uVar36 = ~uVar18 & uVar24 ^ uVar23;
    uVar13 = ~uVar24 & uVar32 ^ uVar18;
    uVar27 = ~uVar23 & uVar18 ^ uVar27;
    uVar16 = uVar16 ^ uVar22;
    uVar22 = uVar22 ^ uVar2;
    uVar2 = uVar16 >> 0x25 | uVar16 << 0x1b;
    uVar37 = uVar37 ^ uVar31;
    uVar18 = uVar37 >> 0x1c | uVar37 << 0x24;
    uVar28 = uVar28 ^ uVar38;
    uVar23 = uVar28 >> 0x36 | uVar28 << 10;
    uVar20 = uVar20 ^ uVar33;
    uVar33 = uVar33 ^ uVar30;
    uVar5 = uVar5 ^ uVar34;
    uVar34 = uVar34 ^ uVar6;
    uVar16 = ~uVar18 & uVar23 ^ uVar2;
    uVar5 = uVar5 >> 0x31 | uVar5 << 0xf;
    uVar20 = uVar20 >> 8 | uVar20 << 0x38;
    uVar19 = ~uVar5 & uVar20 ^ uVar23;
    uVar37 = ~uVar23 & uVar5 ^ uVar18;
    uVar24 = uVar33 >> 9 | uVar33 << 0x37;
    uVar28 = uVar34 >> 2 | uVar34 << 0x3e;
    uVar5 = ~uVar20 & uVar2 ^ uVar5;
    uVar38 = uVar38 ^ uVar3;
    uVar20 = ~uVar2 & uVar18 ^ uVar20;
    uVar31 = uVar31 ^ uVar12;
    uVar23 = uVar38 >> 0x3e | uVar38 << 2;
    uVar3 = uVar31 >> 0x17 | uVar31 << 0x29;
    uVar32 = uVar22 >> 0x19 | uVar22 << 0x27;
    uVar30 = ~uVar23 & uVar28 ^ uVar3;
    uVar33 = ~uVar24 & uVar32 ^ uVar28;
    uVar26 = ~uVar32 & uVar3 ^ uVar24;
    uVar6 = uVar25 ^ uVar5 ^ uVar11 ^ uVar21 ^ uVar30;
    uVar32 = ~uVar3 & uVar23 ^ uVar32;
    uVar23 = ~uVar28 & uVar24 ^ uVar23;
    uVar12 = uVar13 ^ uVar37 ^ uVar4 ^ uVar29 ^ uVar26;
    uVar22 = uVar10 ^ uVar19 ^ uVar14 ^ uVar17 ^ uVar32;
    uVar18 = uVar36 ^ uVar16 ^ uVar7 ^ uVar9 ^ uVar33;
    uVar28 = (uVar6 >> 0x3f | uVar6 << 1) ^ uVar12;
    uVar3 = uVar27 ^ uVar20 ^ uVar1 ^ uVar8 ^ uVar23;
    uVar2 = (uVar12 >> 0x3f | uVar12 << 1) ^ uVar3;
    uVar31 = (uVar3 >> 0x3f | uVar3 << 1) ^ uVar22;
    uVar3 = (uVar22 >> 0x3f | uVar22 << 1) ^ uVar18;
    uVar33 = uVar33 ^ uVar2;
    uVar7 = uVar7 ^ uVar2;
    uVar5 = uVar5 ^ uVar31;
    uVar6 = (uVar18 >> 0x3f | uVar18 << 1) ^ uVar6;
    uVar23 = uVar23 ^ uVar6;
    uVar24 = uVar23 >> 0x32 | uVar23 << 0xe;
    uVar29 = uVar29 ^ uVar3;
    uVar10 = uVar10 ^ uVar28;
    uVar23 = uVar29 >> 0x14 | uVar29 << 0x2c;
    uVar12 = uVar10 >> 0x15 | uVar10 << 0x2b;
    uVar29 = uVar7 ^ 0x80000001 ^ ~uVar23 & uVar12;
    uVar22 = uVar5 >> 0x2b | uVar5 << 0x15;
    uVar38 = ~uVar22 & uVar24 ^ uVar12;
    uVar18 = ~uVar12 & uVar22 ^ uVar23;
    uVar5 = ~uVar7 & uVar23 ^ uVar24;
    uVar22 = ~uVar24 & uVar7 ^ uVar22;
    uVar32 = uVar32 ^ uVar28;
    uVar12 = uVar32 >> 3 | uVar32 << 0x3d;
    uVar37 = uVar37 ^ uVar3;
    uVar11 = uVar11 ^ uVar31;
    uVar37 = uVar37 >> 0x13 | uVar37 << 0x2d;
    uVar23 = uVar11 >> 0x24 | uVar11 << 0x1c;
    uVar8 = uVar8 ^ uVar6;
    uVar8 = uVar8 >> 0x2c | uVar8 << 0x14;
    uVar7 = ~uVar12 & uVar23 ^ uVar37;
    uVar36 = uVar36 ^ uVar2;
    uVar24 = uVar36 >> 0x3d | uVar36 << 3;
    uVar10 = ~uVar37 & uVar12 ^ uVar24;
    uVar36 = ~uVar24 & uVar37 ^ uVar8;
    uVar37 = ~uVar8 & uVar24 ^ uVar23;
    uVar12 = ~uVar23 & uVar8 ^ uVar12;
    uVar23 = uVar33 >> 0x2e | uVar33 << 0x12;
    uVar4 = uVar4 ^ uVar3;
    uVar20 = uVar20 ^ uVar6;
    uVar8 = uVar4 >> 0x3f | uVar4 << 1;
    uVar25 = uVar25 ^ uVar31;
    uVar11 = uVar20 >> 0x38 | uVar20 << 8;
    uVar4 = uVar25 >> 0x27 | uVar25 << 0x19;
    uVar25 = ~uVar11 & uVar23 ^ uVar4;
    uVar17 = uVar17 ^ uVar28;
    uVar24 = uVar17 >> 0x3a | uVar17 << 6;
    uVar17 = ~uVar23 & uVar8 ^ uVar11;
    uVar11 = ~uVar4 & uVar11 ^ uVar24;
    uVar4 = ~uVar24 & uVar4 ^ uVar8;
    uVar23 = ~uVar8 & uVar24 ^ uVar23;
    uVar9 = uVar9 ^ uVar2;
    auVar40 = vpblendd_avx2(ZEXT832(uVar29),auVar42,0xfc);
    uVar13 = uVar13 ^ uVar3;
    uVar9 = uVar9 >> 0x1c | uVar9 << 0x24;
    uVar1 = uVar1 ^ uVar6;
    uVar24 = uVar13 >> 0x36 | uVar13 << 10;
    uVar6 = uVar6 ^ uVar27;
    uVar8 = uVar1 >> 0x25 | uVar1 << 0x1b;
    uVar1 = ~uVar9 & uVar24 ^ uVar8;
    uVar19 = uVar19 ^ uVar28;
    uVar28 = uVar28 ^ uVar14;
    uVar20 = uVar19 >> 0x31 | uVar19 << 0xf;
    uVar13 = ~uVar24 & uVar20 ^ uVar9;
    uVar30 = uVar30 ^ uVar31;
    uVar27 = uVar30 >> 8 | uVar30 << 0x38;
    uVar9 = ~uVar8 & uVar9 ^ uVar27;
    uVar24 = ~uVar20 & uVar27 ^ uVar24;
    uVar20 = ~uVar27 & uVar8 ^ uVar20;
    uVar31 = uVar31 ^ uVar21;
    uVar2 = uVar2 ^ uVar16;
    uVar3 = uVar3 ^ uVar26;
    uVar8 = uVar28 >> 2 | uVar28 << 0x3e;
    uVar19 = uVar6 >> 0x19 | uVar6 << 0x27;
    uVar27 = uVar31 >> 9 | uVar31 << 0x37;
    uVar16 = uVar2 >> 0x17 | uVar2 << 0x29;
    uVar3 = uVar3 >> 0x3e | uVar3 << 2;
    uVar32 = ~uVar27 & uVar19 ^ uVar8;
    uVar2 = ~uVar3 & uVar8 ^ uVar16;
    uVar14 = ~uVar19 & uVar16 ^ uVar27;
    uVar27 = ~uVar8 & uVar27 ^ uVar3;
    uVar19 = ~uVar16 & uVar3 ^ uVar19;
    uVar3 = uVar17 ^ uVar20 ^ uVar22 ^ uVar7 ^ uVar2;
    uVar16 = uVar11 ^ uVar13 ^ uVar18 ^ uVar36 ^ uVar14;
    uVar30 = uVar4 ^ uVar1 ^ uVar29 ^ uVar37 ^ uVar32;
    uVar8 = uVar23 ^ uVar9 ^ uVar5 ^ uVar12 ^ uVar27;
    uVar6 = uVar25 ^ uVar24 ^ uVar38 ^ uVar10 ^ uVar19;
    uVar31 = (uVar3 >> 0x3f | uVar3 << 1) ^ uVar16;
    uVar28 = (uVar8 >> 0x3f | uVar8 << 1) ^ uVar6;
    uVar8 = (uVar16 >> 0x3f | uVar16 << 1) ^ uVar8;
    uVar19 = uVar19 ^ uVar31;
    uVar6 = (uVar6 >> 0x3f | uVar6 << 1) ^ uVar30;
    uVar20 = uVar20 ^ uVar28;
    uVar3 = (uVar30 >> 0x3f | uVar30 << 1) ^ uVar3;
    local_c8 = uVar19 >> 3 | uVar19 << 0x3d;
    uVar32 = uVar32 ^ uVar8;
    uVar2 = uVar2 ^ uVar28;
    uVar36 = uVar36 ^ uVar6;
    uVar27 = uVar27 ^ uVar3;
    uVar13 = uVar13 ^ uVar6;
    uVar16 = uVar36 >> 0x14 | uVar36 << 0x2c;
    local_138 = uVar27 >> 0x32 | uVar27 << 0xe;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar20 >> 0x2b | uVar20 << 0x15;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = local_138;
    auVar47 = vpunpcklqdq_avx(auVar44,auVar47);
    uVar25 = uVar25 ^ uVar31;
    uVar27 = uVar25 >> 0x15 | uVar25 << 0x2b;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar27;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar8;
    auVar48 = vpunpcklqdq_avx(auVar48,auVar46);
    auVar44 = vpunpcklqdq_avx(auVar46,auVar44);
    auVar41._0_16_ = ZEXT116(0) * auVar47 + ZEXT116(1) * auVar48;
    auVar41._16_16_ = ZEXT116(1) * auVar47;
    auVar47 = vpinsrq_avx(auVar43,uVar16,1);
    auVar40 = auVar41 ^ auVar40;
    auVar45._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar47;
    auVar45._16_16_ = ZEXT116(1) * auVar44;
    auVar41 = valignq_avx512vl(auVar40,auVar41,1);
    uVar30 = uVar13 >> 0x13 | uVar13 << 0x2d;
    local_138 = ~auVar40._0_8_ & uVar16 ^ local_138;
    uVar4 = uVar4 ^ uVar8;
    uVar4 = uVar4 >> 0x3d | uVar4 << 3;
    auVar41 = vpand_avx2(auVar40,auVar41);
    auVar41 = vpblendd_avx2(auVar41,auVar40 ^ ZEXT832(~uVar16 & uVar27),3);
    auVar41 = auVar41 ^ auVar45;
    uVar22 = uVar22 ^ uVar28;
    uVar16 = uVar22 >> 0x24 | uVar22 << 0x1c;
    local_118 = ~local_c8 & uVar16 ^ uVar30;
    local_f8 = ~uVar30 & local_c8 ^ uVar4;
    uVar12 = uVar12 ^ uVar3;
    uVar27 = uVar12 >> 0x2c | uVar12 << 0x14;
    local_148 = ~uVar4 & uVar30 ^ uVar27;
    local_d0 = ~uVar27 & uVar4 ^ uVar16;
    local_c8 = ~uVar16 & uVar27 ^ local_c8;
    uVar9 = uVar9 ^ uVar3;
    local_120 = uVar32 >> 0x2e | uVar32 << 0x12;
    uVar22 = uVar9 >> 0x38 | uVar9 << 8;
    uVar10 = uVar10 ^ uVar31;
    uVar18 = uVar18 ^ uVar6;
    uVar27 = uVar10 >> 0x3a | uVar10 << 6;
    uVar16 = uVar18 >> 0x3f | uVar18 << 1;
    local_128 = ~local_120 & uVar16 ^ uVar22;
    uVar17 = uVar17 ^ uVar28;
    uVar28 = uVar28 ^ uVar7;
    uVar12 = uVar17 >> 0x27 | uVar17 << 0x19;
    local_e0 = ~uVar22 & local_120 ^ uVar12;
    local_e8 = ~uVar12 & uVar22 ^ uVar27;
    local_108 = ~uVar27 & uVar12 ^ uVar16;
    local_120 = ~uVar16 & uVar27 ^ local_120;
    local_140 = uVar2 >> 8 | uVar2 << 0x38;
    uVar5 = uVar5 ^ uVar3;
    uVar24 = uVar24 ^ uVar31;
    uVar3 = uVar3 ^ uVar23;
    uVar31 = uVar31 ^ uVar38;
    uVar16 = uVar5 >> 0x25 | uVar5 << 0x1b;
    uVar11 = uVar11 ^ uVar6;
    uVar2 = uVar24 >> 0x31 | uVar24 << 0xf;
    uVar6 = uVar6 ^ uVar14;
    uVar27 = uVar11 >> 0x36 | uVar11 << 10;
    uVar12 = uVar6 >> 0x3e | uVar6 << 2;
    uVar5 = ~uVar2 & local_140 ^ uVar27;
    local_150 = ~local_140 & uVar16 ^ uVar2;
    uVar3 = uVar3 >> 0x19 | uVar3 << 0x27;
    uVar37 = uVar37 ^ uVar8;
    uVar8 = uVar8 ^ uVar1;
    uVar23 = uVar37 >> 0x1c | uVar37 << 0x24;
    local_160 = ~uVar27 & uVar2 ^ uVar23;
    local_f0 = ~uVar23 & uVar27 ^ uVar16;
    local_158 = uVar31 >> 2 | uVar31 << 0x3e;
    uVar27 = uVar28 >> 9 | uVar28 << 0x37;
    local_140 = ~uVar16 & uVar23 ^ local_140;
    uVar8 = uVar8 >> 0x17 | uVar8 << 0x29;
    local_100 = ~uVar12 & local_158 ^ uVar8;
    local_d8 = ~local_158 & uVar27 ^ uVar12;
    local_130 = ~uVar8 & uVar12 ^ uVar3;
    local_110 = ~uVar3 & uVar8 ^ uVar27;
    local_158 = ~uVar27 & uVar3 ^ local_158;
    data = *(undefined1 (*) [32])data + (ulong)laneCount * 8;
  }
  *(undefined1 (*) [32])state = auVar41;
  *(ulong *)((long)state + 0x20) = local_138;
  *(ulong *)((long)state + 0x28) = local_d0;
  *(ulong *)((long)state + 0x30) = local_148;
  *(ulong *)((long)state + 0x38) = local_f8;
  *(ulong *)((long)state + 0x40) = local_118;
  *(ulong *)((long)state + 0x48) = local_c8;
  *(ulong *)((long)state + 0x50) = local_108;
  *(ulong *)((long)state + 0x58) = local_e8;
  *(ulong *)((long)state + 0x60) = local_e0;
  *(ulong *)((long)state + 0x68) = local_128;
  *(ulong *)((long)state + 0x70) = local_120;
  *(ulong *)((long)state + 0x78) = local_f0;
  *(ulong *)((long)state + 0x80) = local_160;
  *(ulong *)((long)state + 0x88) = uVar5;
  *(ulong *)((long)state + 0x90) = local_150;
  *(ulong *)((long)state + 0x98) = local_140;
  *(ulong *)((long)state + 0xa0) = local_158;
  *(ulong *)((long)state + 0xa8) = local_110;
  *(ulong *)((long)state + 0xb0) = local_130;
  *(ulong *)((long)state + 0xb8) = local_100;
  *(ulong *)((long)state + 0xc0) = local_d8;
  return -lVar15;
}

Assistant:

size_t KeccakP1600_12rounds_FastLoop_Absorb(void *state, unsigned int laneCount, const unsigned char *data, size_t dataByteLen)
{
    size_t originalDataByteLen = dataByteLen;
    declareABCDE
    #ifndef KeccakP1600_fullUnrolling
    unsigned int i;
    #endif
    uint64_t *stateAsLanes = (uint64_t*)state;
    uint64_t *inDataAsLanes = (uint64_t*)data;

    copyFromState(A, stateAsLanes)
    while(dataByteLen >= laneCount*8) {
        addInput(A, inDataAsLanes, laneCount)
        rounds12
        inDataAsLanes += laneCount;
        dataByteLen -= laneCount*8;
    }
    copyToState(stateAsLanes, A)
    return originalDataByteLen - dataByteLen;
}